

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O1

void kat::GetRowORD(map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                    *data_plt,fin_data *row)

{
  mapped_type *__dest;
  float periodWeight;
  period_event periodEventID;
  undefined1 local_24 [4];
  key_type local_20;
  
  __isoc99_sscanf(row->data,"%d,%f,%d",&local_20,local_24,&local_20.eventID);
  __dest = std::
           map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
           ::operator[](data_plt,&local_20);
  memcpy(__dest,row,0x1008);
  return;
}

Assistant:

void GetRowORD(std::map<period_event, fin_data> &data_plt,
		       const fin_data &row) {
		// Sort by period number and then event number
		period_event periodEventID;
		float periodWeight;   // Not used but needs to be read in
		sscanf(row.data, "%d,%f,%d", &periodEventID.period,
		       &periodWeight, &periodEventID.eventID);
		data_plt[periodEventID] = row;
	}